

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3FindInIndex(Parse *pParse,Expr *pX,u32 inFlags,int *prRhsHasNull,int *aiMap)

{
  byte bVar1;
  ushort uVar2;
  short sVar3;
  u32 uVar4;
  ExprList *pEVar5;
  SrcList *pSVar6;
  sqlite3 *db;
  Table *pTab;
  i16 *piVar7;
  char cVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  Vdbe *p;
  Select *pSVar12;
  ulong uVar13;
  Expr *pEVar14;
  Expr *pLeft;
  CollSeq *pCVar15;
  char *zP4;
  u8 uVar16;
  char aff2;
  uint uVar17;
  long lVar18;
  Op *pOVar19;
  int iVar20;
  Schema **ppSVar21;
  long lVar22;
  int iVar23;
  ulong uVar24;
  ExprList_item *pEVar25;
  bool bVar26;
  Index *local_d0;
  int *local_c0;
  Walker local_60;
  
  iVar20 = pParse->nTab;
  pParse->nTab = iVar20 + 1;
  p = pParse->pVdbe;
  if (p == (Vdbe *)0x0) {
    p = allocVdbe(pParse);
  }
  iVar23 = 0;
  if (prRhsHasNull == (int *)0x0) {
    local_c0 = (int *)0x0;
  }
  else {
    local_c0 = prRhsHasNull;
    if ((pX->flags & 0x800) != 0) {
      pEVar5 = ((pX->x).pSelect)->pEList;
      uVar17 = pEVar5->nExpr;
      if ((int)uVar17 < 1) {
        uVar24 = 0;
      }
      else {
        pEVar25 = pEVar5->a;
        uVar24 = 0;
        do {
          iVar9 = sqlite3ExprCanBeNull(pEVar25->pExpr);
          if (iVar9 != 0) goto LAB_00238484;
          uVar24 = uVar24 + 1;
          pEVar25 = pEVar25 + 1;
        } while (uVar17 != uVar24);
        uVar24 = (ulong)uVar17;
      }
LAB_00238484:
      local_c0 = prRhsHasNull;
      if ((uint)uVar24 == uVar17) {
        local_c0 = (int *)0x0;
      }
    }
  }
  if (pParse->nErr == 0) {
    iVar23 = 0;
    if (((((pX->flags & 0x820) == 0x800) &&
         (pSVar12 = (pX->x).pSelect, pSVar12->pPrior == (Select *)0x0)) &&
        ((pSVar12->selFlags & 9) == 0)) &&
       (((pSVar12->pLimit == (Expr *)0x0 && (pSVar12->pWhere == (Expr *)0x0)) &&
        ((pSVar6 = pSVar12->pSrc, pSVar6->nSrc == 1 &&
         ((pSVar6->a[0].pSelect == (Select *)0x0 && ((pSVar6->a[0].pTab)->nModuleArg == 0)))))))) {
      lVar18 = (long)pSVar12->pEList->nExpr;
      if (0 < lVar18) {
        lVar22 = 0;
        do {
          if (**(char **)((long)&pSVar12->pEList->a[0].pExpr + lVar22) != -0x68) goto LAB_0023859d;
          lVar22 = lVar22 + 0x20;
        } while (lVar18 * 0x20 != lVar22);
      }
    }
    else {
LAB_0023859d:
      pSVar12 = (Select *)0x0;
    }
    if (pSVar12 != (Select *)0x0) {
      db = pParse->db;
      pEVar5 = pSVar12->pEList;
      uVar17 = pEVar5->nExpr;
      pTab = pSVar12->pSrc->a[0].pTab;
      if (pTab->pSchema == (Schema *)0x0) {
        uVar24 = 0xfff0bdc0;
      }
      else {
        uVar10 = db->nDb;
        if ((int)uVar10 < 1) {
          uVar24 = 0;
        }
        else {
          ppSVar21 = &db->aDb->pSchema;
          uVar13 = 0;
          do {
            uVar24 = uVar13;
            if (*ppSVar21 == pTab->pSchema) break;
            uVar13 = uVar13 + 1;
            ppSVar21 = ppSVar21 + 4;
            uVar24 = (ulong)uVar10;
          } while (uVar10 != uVar13);
        }
      }
      iVar9 = (int)(short)uVar24;
      sqlite3CodeVerifySchema(pParse,iVar9);
      sqlite3TableLock(pParse,iVar9,pTab->tnum,'\0',pTab->zName);
      if ((uVar17 == 1) && ((pEVar5->a[0].pExpr)->iColumn < 0)) {
        iVar23 = sqlite3VdbeAddOp3(p,0x14,0,0,0);
        sqlite3OpenTable(pParse,iVar20,iVar9,pTab,0x68);
        if (p->db->mallocFailed == '\0') {
          iVar9 = p->nOp + -1;
          if (-1 < iVar23) {
            iVar9 = iVar23;
          }
          pOVar19 = p->aOp + iVar9;
        }
        else {
          pOVar19 = (Op *)&sqlite3VdbeGetOp_dummy;
        }
        pOVar19->p2 = p->nOp;
        iVar23 = 1;
      }
      else {
        if ((int)uVar17 < 1) {
LAB_002387b6:
          local_d0 = pTab->pIndex;
          if (local_d0 != (Index *)0x0) {
            do {
              uVar2 = local_d0->nColumn;
              iVar23 = 0;
              if (uVar2 < 0x3f) {
                iVar23 = 0;
                if (((int)uVar17 <= (int)(uint)uVar2) &&
                   (((inFlags & 4) == 0 ||
                    ((iVar23 = 0, (int)(uint)local_d0->nKeyCol <= (int)uVar17 &&
                     (((int)(uint)uVar2 <= (int)uVar17 || (iVar23 = 0, local_d0->onError != '\0'))))
                    )))) {
                  if ((int)uVar17 < 1) {
                    uVar24 = 0;
                  }
                  else {
                    lVar18 = 0;
                    uVar24 = 0;
                    do {
                      pLeft = sqlite3VectorFieldSubexpr(pX->pLeft,(int)lVar18);
                      pEVar14 = pEVar5->a[lVar18].pExpr;
                      pCVar15 = sqlite3BinaryCompareCollSeq(pParse,pLeft,pEVar14);
                      piVar7 = local_d0->aiColumn;
                      sVar3 = pEVar14->iColumn;
                      uVar13 = 0;
                      do {
                        if ((piVar7[uVar13] == sVar3) &&
                           ((pCVar15 == (CollSeq *)0x0 ||
                            (iVar23 = sqlite3StrICmp(pCVar15->zName,local_d0->azColl[uVar13]),
                            iVar23 == 0)))) goto LAB_00238896;
                        uVar13 = uVar13 + 1;
                      } while (uVar17 != uVar13);
                      uVar13 = (ulong)uVar17;
LAB_00238896:
                      if (((uint)uVar13 == uVar17) || ((uVar24 >> (uVar13 & 0x3f) & 1) != 0)) {
                        bVar26 = false;
                      }
                      else {
                        uVar24 = uVar24 | 1L << ((byte)uVar13 & 0x3f);
                        bVar26 = true;
                        if (aiMap != (int *)0x0) {
                          aiMap[lVar18] = (uint)uVar13;
                        }
                      }
                    } while ((bVar26) && (lVar18 = lVar18 + 1, lVar18 < (int)uVar17));
                  }
                  iVar23 = 0;
                  if ((uVar24 ^ -1L << ((byte)uVar17 & 0x3f)) == 0xffffffffffffffff) {
                    iVar23 = sqlite3VdbeAddOp3(p,0x14,0,0,0);
                    zP4 = sqlite3MPrintf(db,"USING INDEX %s FOR IN-OPERATOR",local_d0->zName);
                    iVar11 = sqlite3VdbeAddOp3(p,0xa7,0,0,0);
                    sqlite3VdbeChangeP4(p,iVar11,zP4,-7);
                    sqlite3VdbeAddOp3(p,0x68,iVar20,local_d0->tnum,iVar9);
                    sqlite3VdbeSetP4KeyInfo(pParse,local_d0);
                    bVar1 = *local_d0->aSortOrder;
                    if (local_c0 != (int *)0x0) {
                      iVar11 = pParse->nMem + 1;
                      pParse->nMem = iVar11;
                      *local_c0 = iVar11;
                      if (uVar17 == 1) {
                        sqlite3SetHasNullFlag(p,iVar20,iVar11);
                      }
                    }
                    pOVar19 = (Op *)&sqlite3VdbeGetOp_dummy;
                    if (p->db->mallocFailed == '\0') {
                      iVar11 = p->nOp + -1;
                      if (-1 < iVar23) {
                        iVar11 = iVar23;
                      }
                      pOVar19 = p->aOp + iVar11;
                    }
                    iVar23 = bVar1 + 3;
                    pOVar19->p2 = p->nOp;
                  }
                }
              }
              local_d0 = local_d0->pNext;
            } while ((local_d0 != (Index *)0x0) && (iVar23 == 0));
            goto LAB_002384a1;
          }
        }
        else {
          pEVar25 = pEVar5->a;
          uVar24 = 0;
          do {
            pEVar14 = sqlite3VectorFieldSubexpr(pX->pLeft,(int)uVar24);
            lVar18 = (long)pEVar25->pExpr->iColumn;
            if (lVar18 < 0) {
              aff2 = 'D';
            }
            else {
              aff2 = pTab->aCol[lVar18].affinity;
            }
            cVar8 = sqlite3CompareAffinity(pEVar14,aff2);
            bVar26 = (byte)(cVar8 + 0xbfU) < 2;
            uVar24 = uVar24 + 1;
          } while ((uVar24 < uVar17) && (pEVar25 = pEVar25 + 1, 'B' < aff2 || bVar26));
          if ('B' < aff2 || bVar26) goto LAB_002387b6;
        }
        iVar23 = 0;
      }
    }
  }
LAB_002384a1:
  if (((iVar23 == 0) && (iVar23 = 0, (inFlags & 1) != 0)) && ((pX->flags & 0x800) == 0)) {
    pEVar14 = pX->pLeft;
    pX->pLeft = (Expr *)0x0;
    local_60.eCode = '\x01';
    local_60.xExprCallback = exprNodeIsConstant;
    local_60.xSelectCallback = selectNodeIsConstant;
    local_60.u.n = 0;
    if (pX != (Expr *)0x0) {
      walkExpr(&local_60,pX);
    }
    pX->pLeft = pEVar14;
    if ((local_60.eCode == '\0') || (((pX->x).pList)->nExpr < 3)) {
      iVar23 = 5;
    }
  }
  if (iVar23 == 0) {
    uVar4 = pParse->nQueryLoop;
    if ((inFlags & 4) == 0) {
      iVar23 = 2;
      uVar17 = 0;
      if (local_c0 == (int *)0x0) {
        iVar20 = 0;
      }
      else {
        iVar20 = pParse->nMem + 1;
        pParse->nMem = iVar20;
        *local_c0 = iVar20;
        uVar17 = 0;
      }
    }
    else {
      pParse->nQueryLoop = 0;
      iVar23 = 2;
      iVar20 = 0;
      if (pX->pLeft->iColumn < 0) {
        uVar10 = pX->flags & 0x800;
        uVar17 = uVar10 >> 0xb ^ 1;
        iVar23 = 2 - (uint)(uVar10 == 0);
      }
      else {
        uVar17 = 0;
      }
    }
    sqlite3CodeSubselect(pParse,pX,iVar20,uVar17);
    pParse->nQueryLoop = uVar4;
  }
  else {
    pX->iTable = iVar20;
  }
  if (aiMap == (int *)0x0) {
    return iVar23;
  }
  if (0xfffffffd < iVar23 - 5U) {
    return iVar23;
  }
  pEVar14 = pX->pLeft;
  uVar16 = pEVar14->op;
  if (uVar16 == 0x9d) {
    uVar16 = pEVar14->op2;
  }
  if (uVar16 == 'w') {
    pSVar12 = (pEVar14->x).pSelect;
  }
  else {
    uVar17 = 1;
    if (uVar16 != 0x9e) goto LAB_002386d0;
    pSVar12 = (Select *)&pEVar14->x;
  }
  uVar17 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar12->pEList)->pList->nExpr;
LAB_002386d0:
  if (0 < (int)uVar17) {
    uVar24 = 0;
    do {
      aiMap[uVar24] = (int)uVar24;
      uVar24 = uVar24 + 1;
    } while (uVar17 != uVar24);
  }
  return iVar23;
}

Assistant:

SQLITE_PRIVATE int sqlite3FindInIndex(
  Parse *pParse,             /* Parsing context */
  Expr *pX,                  /* The right-hand side (RHS) of the IN operator */
  u32 inFlags,               /* IN_INDEX_LOOP, _MEMBERSHIP, and/or _NOOP_OK */
  int *prRhsHasNull,         /* Register holding NULL status.  See notes */
  int *aiMap                 /* Mapping from Index fields to RHS fields */
){
  Select *p;                            /* SELECT to the right of IN operator */
  int eType = 0;                        /* Type of RHS table. IN_INDEX_* */
  int iTab = pParse->nTab++;            /* Cursor of the RHS table */
  int mustBeUnique;                     /* True if RHS must be unique */
  Vdbe *v = sqlite3GetVdbe(pParse);     /* Virtual machine being coded */

  assert( pX->op==TK_IN );
  mustBeUnique = (inFlags & IN_INDEX_LOOP)!=0;

  /* If the RHS of this IN(...) operator is a SELECT, and if it matters 
  ** whether or not the SELECT result contains NULL values, check whether
  ** or not NULL is actually possible (it may not be, for example, due 
  ** to NOT NULL constraints in the schema). If no NULL values are possible,
  ** set prRhsHasNull to 0 before continuing.  */
  if( prRhsHasNull && (pX->flags & EP_xIsSelect) ){
    int i;
    ExprList *pEList = pX->x.pSelect->pEList;
    for(i=0; i<pEList->nExpr; i++){
      if( sqlite3ExprCanBeNull(pEList->a[i].pExpr) ) break;
    }
    if( i==pEList->nExpr ){
      prRhsHasNull = 0;
    }
  }

  /* Check to see if an existing table or index can be used to
  ** satisfy the query.  This is preferable to generating a new 
  ** ephemeral table.  */
  if( pParse->nErr==0 && (p = isCandidateForInOpt(pX))!=0 ){
    sqlite3 *db = pParse->db;              /* Database connection */
    Table *pTab;                           /* Table <table>. */
    i16 iDb;                               /* Database idx for pTab */
    ExprList *pEList = p->pEList;
    int nExpr = pEList->nExpr;

    assert( p->pEList!=0 );             /* Because of isCandidateForInOpt(p) */
    assert( p->pEList->a[0].pExpr!=0 ); /* Because of isCandidateForInOpt(p) */
    assert( p->pSrc!=0 );               /* Because of isCandidateForInOpt(p) */
    pTab = p->pSrc->a[0].pTab;

    /* Code an OP_Transaction and OP_TableLock for <table>. */
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
    sqlite3CodeVerifySchema(pParse, iDb);
    sqlite3TableLock(pParse, iDb, pTab->tnum, 0, pTab->zName);

    assert(v);  /* sqlite3GetVdbe() has always been previously called */
    if( nExpr==1 && pEList->a[0].pExpr->iColumn<0 ){
      /* The "x IN (SELECT rowid FROM table)" case */
      int iAddr = sqlite3VdbeAddOp0(v, OP_Once);
      VdbeCoverage(v);

      sqlite3OpenTable(pParse, iTab, iDb, pTab, OP_OpenRead);
      eType = IN_INDEX_ROWID;

      sqlite3VdbeJumpHere(v, iAddr);
    }else{
      Index *pIdx;                         /* Iterator variable */
      int affinity_ok = 1;
      int i;

      /* Check that the affinity that will be used to perform each 
      ** comparison is the same as the affinity of each column in table
      ** on the RHS of the IN operator.  If it not, it is not possible to
      ** use any index of the RHS table.  */
      for(i=0; i<nExpr && affinity_ok; i++){
        Expr *pLhs = sqlite3VectorFieldSubexpr(pX->pLeft, i);
        int iCol = pEList->a[i].pExpr->iColumn;
        char idxaff = sqlite3TableColumnAffinity(pTab,iCol); /* RHS table */
        char cmpaff = sqlite3CompareAffinity(pLhs, idxaff);
        testcase( cmpaff==SQLITE_AFF_BLOB );
        testcase( cmpaff==SQLITE_AFF_TEXT );
        switch( cmpaff ){
          case SQLITE_AFF_BLOB:
            break;
          case SQLITE_AFF_TEXT:
            /* sqlite3CompareAffinity() only returns TEXT if one side or the
            ** other has no affinity and the other side is TEXT.  Hence,
            ** the only way for cmpaff to be TEXT is for idxaff to be TEXT
            ** and for the term on the LHS of the IN to have no affinity. */
            assert( idxaff==SQLITE_AFF_TEXT );
            break;
          default:
            affinity_ok = sqlite3IsNumericAffinity(idxaff);
        }
      }

      if( affinity_ok ){
        /* Search for an existing index that will work for this IN operator */
        for(pIdx=pTab->pIndex; pIdx && eType==0; pIdx=pIdx->pNext){
          Bitmask colUsed;      /* Columns of the index used */
          Bitmask mCol;         /* Mask for the current column */
          if( pIdx->nColumn<nExpr ) continue;
          /* Maximum nColumn is BMS-2, not BMS-1, so that we can compute
          ** BITMASK(nExpr) without overflowing */
          testcase( pIdx->nColumn==BMS-2 );
          testcase( pIdx->nColumn==BMS-1 );
          if( pIdx->nColumn>=BMS-1 ) continue;
          if( mustBeUnique ){
            if( pIdx->nKeyCol>nExpr
             ||(pIdx->nColumn>nExpr && !IsUniqueIndex(pIdx))
            ){
              continue;  /* This index is not unique over the IN RHS columns */
            }
          }
  
          colUsed = 0;   /* Columns of index used so far */
          for(i=0; i<nExpr; i++){
            Expr *pLhs = sqlite3VectorFieldSubexpr(pX->pLeft, i);
            Expr *pRhs = pEList->a[i].pExpr;
            CollSeq *pReq = sqlite3BinaryCompareCollSeq(pParse, pLhs, pRhs);
            int j;
  
            assert( pReq!=0 || pRhs->iColumn==XN_ROWID || pParse->nErr );
            for(j=0; j<nExpr; j++){
              if( pIdx->aiColumn[j]!=pRhs->iColumn ) continue;
              assert( pIdx->azColl[j] );
              if( pReq!=0 && sqlite3StrICmp(pReq->zName, pIdx->azColl[j])!=0 ){
                continue;
              }
              break;
            }
            if( j==nExpr ) break;
            mCol = MASKBIT(j);
            if( mCol & colUsed ) break; /* Each column used only once */
            colUsed |= mCol;
            if( aiMap ) aiMap[i] = j;
          }
  
          assert( i==nExpr || colUsed!=(MASKBIT(nExpr)-1) );
          if( colUsed==(MASKBIT(nExpr)-1) ){
            /* If we reach this point, that means the index pIdx is usable */
            int iAddr = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
#ifndef SQLITE_OMIT_EXPLAIN
            sqlite3VdbeAddOp4(v, OP_Explain, 0, 0, 0,
              sqlite3MPrintf(db, "USING INDEX %s FOR IN-OPERATOR",pIdx->zName),
              P4_DYNAMIC);
#endif
            sqlite3VdbeAddOp3(v, OP_OpenRead, iTab, pIdx->tnum, iDb);
            sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
            VdbeComment((v, "%s", pIdx->zName));
            assert( IN_INDEX_INDEX_DESC == IN_INDEX_INDEX_ASC+1 );
            eType = IN_INDEX_INDEX_ASC + pIdx->aSortOrder[0];
  
            if( prRhsHasNull ){
#ifdef SQLITE_ENABLE_COLUMN_USED_MASK
              i64 mask = (1<<nExpr)-1;
              sqlite3VdbeAddOp4Dup8(v, OP_ColumnsUsed, 
                  iTab, 0, 0, (u8*)&mask, P4_INT64);
#endif
              *prRhsHasNull = ++pParse->nMem;
              if( nExpr==1 ){
                sqlite3SetHasNullFlag(v, iTab, *prRhsHasNull);
              }
            }
            sqlite3VdbeJumpHere(v, iAddr);
          }
        } /* End loop over indexes */
      } /* End if( affinity_ok ) */
    } /* End if not an rowid index */
  } /* End attempt to optimize using an index */

  /* If no preexisting index is available for the IN clause
  ** and IN_INDEX_NOOP is an allowed reply
  ** and the RHS of the IN operator is a list, not a subquery
  ** and the RHS is not constant or has two or fewer terms,
  ** then it is not worth creating an ephemeral table to evaluate
  ** the IN operator so return IN_INDEX_NOOP.
  */
  if( eType==0
   && (inFlags & IN_INDEX_NOOP_OK)
   && !ExprHasProperty(pX, EP_xIsSelect)
   && (!sqlite3InRhsIsConstant(pX) || pX->x.pList->nExpr<=2)
  ){
    eType = IN_INDEX_NOOP;
  }

  if( eType==0 ){
    /* Could not find an existing table or index to use as the RHS b-tree.
    ** We will have to generate an ephemeral table to do the job.
    */
    u32 savedNQueryLoop = pParse->nQueryLoop;
    int rMayHaveNull = 0;
    eType = IN_INDEX_EPH;
    if( inFlags & IN_INDEX_LOOP ){
      pParse->nQueryLoop = 0;
      if( pX->pLeft->iColumn<0 && !ExprHasProperty(pX, EP_xIsSelect) ){
        eType = IN_INDEX_ROWID;
      }
    }else if( prRhsHasNull ){
      *prRhsHasNull = rMayHaveNull = ++pParse->nMem;
    }
    sqlite3CodeSubselect(pParse, pX, rMayHaveNull, eType==IN_INDEX_ROWID);
    pParse->nQueryLoop = savedNQueryLoop;
  }else{
    pX->iTable = iTab;
  }

  if( aiMap && eType!=IN_INDEX_INDEX_ASC && eType!=IN_INDEX_INDEX_DESC ){
    int i, n;
    n = sqlite3ExprVectorSize(pX->pLeft);
    for(i=0; i<n; i++) aiMap[i] = i;
  }
  return eType;
}